

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

Property * __thiscall ODDLParser::DDLNode::findPropertyByName(DDLNode *this,string *name)

{
  char *__s1;
  int iVar1;
  ulong uVar2;
  char *__s2;
  size_t __n;
  Property *pPStack_28;
  int res;
  Property *current;
  string *name_local;
  DDLNode *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (this->m_properties != (Property *)0x0)) {
    for (pPStack_28 = this->m_properties; pPStack_28 != (Property *)0x0;
        pPStack_28 = pPStack_28->m_next) {
      __s1 = pPStack_28->m_key->m_buffer;
      __s2 = (char *)std::__cxx11::string::c_str();
      __n = std::__cxx11::string::size();
      iVar1 = strncmp(__s1,__s2,__n);
      if (iVar1 == 0) {
        return pPStack_28;
      }
    }
  }
  return (Property *)0x0;
}

Assistant:

Property *DDLNode::findPropertyByName( const std::string &name ) {
    if( name.empty() ) {
        return ddl_nullptr;
    }

    if( ddl_nullptr == m_properties ) {
        return ddl_nullptr;
    }

    Property *current( m_properties );
    while( ddl_nullptr != current ) {
        int res = strncmp( current->m_key->m_buffer, name.c_str(), name.size() );
        if( 0 == res ) {
            return current;
        }
        current = current->m_next;
    }

    return ddl_nullptr;
}